

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall el::Logger::resolveLoggerFormatSpec(Logger *this)

{
  char cVar1;
  EnumType lIndex;
  ushort local_2a;
  Logger *local_28;
  ushort *local_20;
  code *local_18;
  code *local_10;
  
  local_20 = &local_2a;
  local_2a = 2;
  local_10 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3593:44)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3593:44)>
             ::_M_manager;
  local_28 = this;
  do {
    cVar1 = (*local_10)(&local_28);
    if ((cVar1 != '\0') || (local_2a = local_2a * 2, 0x80 < local_2a)) goto LAB_0011954d;
  } while (local_18 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_0011954d:
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

void resolveLoggerFormatSpec(void) const {
        base::type::EnumType lIndex = LevelHelper::kMinValid;
        LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
            base::LogFormat* logFormat = 
                const_cast<base::LogFormat*>(&m_typedConfigurations->logFormat(LevelHelper::castFromInt(lIndex)));
            base::utils::Str::replaceFirstWithEscape(logFormat->m_format, base::consts::kLoggerIdFormatSpecifier, m_id);
            return false;
        });
    }